

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_casetab.cpp
# Opt level: O2

bool parse(char *line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arr)

{
  char *pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(arr);
  iVar2 = 0xe;
  while (line != (char *)0x0) {
    pcVar1 = strchr(line,0x3b);
    if (pcVar1 == (char *)0x0) break;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (pcVar1 == line) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,line,pcVar1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)arr,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    iVar2 = iVar2 + -1;
    line = pcVar1 + 1;
  }
  return iVar2 == 0;
}

Assistant:

bool parse (const char* line, vector<string>& arr)
{
  int nf = 0;
  arr.clear ();
  while (line)
  {
    const char* pend = strchr (line, ';');
    if (!pend)
      break;
    size_t len = pend - line;
    arr.push_back (len ? string (line, len) : string ());
    line = pend + 1;
    ++nf;
  }
  return (nf == 14);
}